

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

cio_error send_frame(cio_websocket *websocket,cio_websocket_write_job *job,size_t frame_length)

{
  size_t *psVar1;
  uint8_t *mask_00;
  cio_write_buffer *pcVar2;
  cio_write_buffer *pcVar3;
  uint16_t uVar4;
  cio_error cVar5;
  undefined8 in_RAX;
  uint64_t uVar6;
  byte bVar7;
  uint i;
  long lVar8;
  size_t mask_length;
  byte bVar9;
  size_t sVar10;
  uint8_t mask [4];
  uint8_t new_mask [4];
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (job->is_continuation_chunk != false) {
    if (((websocket->ws_private).ws_flags.field_0x1 & 4) == 0) {
      mask_00 = (websocket->ws_private).chunk_send_mask;
      mask_write_buffer(job->wbh,mask_00,frame_length);
      sVar10 = (job->wbh->data).element.length;
      lVar8 = 0;
      do {
        *(uint8_t *)((long)&local_38 + lVar8 + 4) = mask_00[(int)sVar10 + (int)lVar8 & 3];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      *(undefined4 *)mask_00 = local_38._4_4_;
    }
    cVar5 = cio_buffered_stream_write
                      (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                       job->stream_handler,websocket);
    return cVar5;
  }
  bVar7 = (byte)job->frame_type;
  bVar9 = bVar7 | 0x80;
  if (job->last_frame == false) {
    bVar9 = bVar7;
  }
  job->send_header[0] = bVar9;
  if (frame_length < 0x7e) {
    sVar10 = 2;
    bVar9 = (byte)frame_length;
  }
  else if (frame_length < 0x10000) {
    uVar4 = cio_htobe16((uint16_t)frame_length);
    *(uint16_t *)(job->send_header + 2) = uVar4;
    bVar9 = 0x7e;
    sVar10 = 4;
  }
  else {
    uVar6 = cio_htobe64(frame_length);
    *(uint64_t *)(job->send_header + 2) = uVar6;
    bVar9 = 0x7f;
    sVar10 = 10;
  }
  if (((websocket->ws_private).ws_flags.field_0x1 & 4) == 0) {
    cio_random_get_bytes(&(websocket->ws_private).rng,&local_38,4);
    *(undefined4 *)(job->send_header + sVar10) = (undefined4)local_38;
    mask_write_buffer(job->wbh,(uint8_t *)&local_38,mask_length);
    if ((job->wbh->data).element.length < frame_length) {
      *(undefined4 *)(websocket->ws_private).chunk_send_mask = (undefined4)local_38;
    }
    bVar9 = bVar9 | 0x80;
    sVar10 = sVar10 + 4;
  }
  job->send_header[1] = bVar9;
  (job->websocket_header).data.head.q_len = (size_t)job->send_header;
  (job->websocket_header).data.element.length = sVar10;
  pcVar2 = job->wbh;
  pcVar3 = pcVar2->next;
  (job->websocket_header).next = pcVar3;
  (job->websocket_header).prev = pcVar2;
  pcVar2->next = &job->websocket_header;
  pcVar3->prev = &job->websocket_header;
  (pcVar2->data).head.q_len = (pcVar2->data).head.q_len + 1;
  psVar1 = &(pcVar2->data).element.length;
  *psVar1 = *psVar1 + (job->websocket_header).data.element.length;
  cVar5 = cio_buffered_stream_write
                    (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                     job->stream_handler,websocket);
  return cVar5;
}

Assistant:

static enum cio_error send_frame(struct cio_websocket *websocket, struct cio_websocket_write_job *job, size_t frame_length)
{
	if (!job->is_continuation_chunk) {
		uint8_t first_len = 0;
		size_t header_index = 2;

		uint8_t first_byte = (uint8_t)job->frame_type;
		if (job->last_frame) {
			first_byte |= WS_HEADER_FIN;
		}

		job->send_header[0] = first_byte;

		if (frame_length <= CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
			first_len = (uint8_t)frame_length;
		} else if (frame_length <= WS_MID_FRAME_SIZE) {
			uint16_t be_len = cio_htobe16((uint16_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 1;
		} else {
			uint64_t be_len = cio_htobe64((uint64_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 2;
		}

		if (websocket->ws_private.ws_flags.is_server == 0U) {
			first_len |= WS_MASK_SET;
			uint8_t mask[4];
			cio_random_get_bytes(&websocket->ws_private.rng, mask, sizeof(mask));
			memcpy(&job->send_header[header_index], &mask, sizeof(mask));

			header_index += sizeof(mask);
			mask_write_buffer(job->wbh, mask, sizeof(mask));

			size_t job_length = cio_write_buffer_get_total_size(job->wbh);
			if (job_length < frame_length) {
				memcpy(websocket->ws_private.chunk_send_mask, mask, sizeof(mask));
			}
		}

		job->send_header[1] = first_len;

		cio_write_buffer_element_init(&job->websocket_header, job->send_header, header_index);
		add_websocket_header(job);
		struct cio_http_client *client = websocket->ws_private.http_client;
		return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
	}

	if (websocket->ws_private.ws_flags.is_server == 0U) {
		mask_write_buffer(job->wbh, websocket->ws_private.chunk_send_mask, sizeof(websocket->ws_private.chunk_send_mask));
		size_t job_length = cio_write_buffer_get_total_size(job->wbh);
		cio_websocket_correct_mask(websocket->ws_private.chunk_send_mask, job_length);
	}

	struct cio_http_client *client = websocket->ws_private.http_client;
	return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
}